

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (string *__return_storage_ptr__,Option *this,optional<unsigned_int> *target,
          string_view name,string_view value)

{
  _Optional_payload_base<unsigned_int> _Var1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  _Var1 = (_Optional_payload_base<unsigned_int>)
          parseInt<unsigned_int>(name,value,__return_storage_ptr__);
  (target->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
  super__Optional_payload_base<unsigned_int> = _Var1;
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::optional<uint32_t>& target, std::string_view name,
                                     std::string_view value) {
    std::string error;
    target = parseInt<uint32_t>(name, value, error);
    return error;
}